

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_parse_flags_extension(CBS *cbs,SSLFlags *out,uint8_t *out_alert,bool allow_unknown)

{
  int iVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint8_t *puVar4;
  unsigned_long *puVar5;
  unsigned_long local_68;
  size_t local_60;
  undefined1 local_54 [4];
  undefined1 local_50 [4];
  uint8_t padded [4];
  CBS flags;
  CBS copy;
  bool allow_unknown_local;
  uint8_t *out_alert_local;
  SSLFlags *out_local;
  CBS *cbs_local;
  
  flags.len = (size_t)cbs->data;
  iVar1 = CBS_get_u8_length_prefixed((CBS *)&flags.len,(CBS *)local_50);
  if (((iVar1 == 0) || (sVar3 = CBS_len((CBS *)&flags.len), sVar3 != 0)) ||
     (sVar3 = CBS_len((CBS *)local_50), sVar3 == 0)) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x17f);
    *out_alert = '2';
    return false;
  }
  puVar4 = CBS_data((CBS *)local_50);
  sVar3 = CBS_len((CBS *)local_50);
  if (puVar4[sVar3 - 1] == '\0') {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x186);
    *out_alert = '/';
    return false;
  }
  if ((!allow_unknown) && (sVar3 = CBS_len((CBS *)local_50), 4 < sVar3)) {
    ERR_put_error(0x10,0,0xde,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,400);
    *out_alert = '/';
    return false;
  }
  memset(local_54,0,4);
  puVar4 = CBS_data((CBS *)local_50);
  local_60 = CBS_len((CBS *)local_50);
  local_68 = 4;
  puVar5 = std::min<unsigned_long>(&local_60,&local_68);
  ::OPENSSL_memcpy(local_54,puVar4,*puVar5);
  uVar2 = CRYPTO_load_u32_le(local_54);
  *out = uVar2;
  return true;
}

Assistant:

static bool ssl_parse_flags_extension(const CBS *cbs, SSLFlags *out,
                                      uint8_t *out_alert, bool allow_unknown) {
  CBS copy = *cbs, flags;
  if (!CBS_get_u8_length_prefixed(&copy, &flags) ||  //
      CBS_len(&copy) != 0 ||                         //
      CBS_len(&flags) == 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  // There may not be any trailing zeros.
  if (CBS_data(&flags)[CBS_len(&flags) - 1] == 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // We can only represent flags that fit in SSLFlags, so any bits beyond that
  // are necessarily unsolicited. Unsolicited flags are allowed in CH, CR, and
  // NST, but forbidden in SH, EE, CT, and HRR. See Section 3 of
  // draft-ietf-tls-tlsflags-14.
  if (!allow_unknown && CBS_len(&flags) > sizeof(SSLFlags)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // We currently use the same in-memory and wire representation for flags.
  uint8_t padded[sizeof(SSLFlags)] = {0};
  OPENSSL_memcpy(padded, CBS_data(&flags),
                 std::min(CBS_len(&flags), size_t{4}));
  static_assert(sizeof(SSLFlags) == sizeof(uint32_t),
                "We currently assume SSLFlags is 32-bit");
  *out = CRYPTO_load_u32_le(padded);
  return true;
}